

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O0

void __thiscall
axl::enc::Utf8ReverseDfa::
emitErrorPendingCus<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8ReverseDecoder>::EncodingEmitter_s>
          (Utf8ReverseDfa *this,uchar_t c,uint_t nextState,EncodingEmitter_s *emitter,utf8_t *p)

{
  uint_t in_EDX;
  EncodingEmitter_u *in_RDI;
  uint_t cc;
  undefined4 in_stack_ffffffffffffffc8;
  
  UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>::isReady(in_EDX);
  if ((in_EDX == 0x6000018) || (in_EDX == 0x6000058)) {
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
  }
  else if (in_EDX == 0x60c123b) {
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(0x60c123b,in_stack_ffffffffffffffc8),0);
  }
  else if ((in_EDX == 0xc000028) || (in_EDX == 0xc000068)) {
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
  }
  else if ((in_EDX == 0x12000048) || (in_EDX == 0x12000078)) {
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
    Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>::
    EncodingEmitter_u::emitCu(in_RDI,(SrcUnit *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),0);
  }
  return;
}

Assistant:

void
	emitErrorPendingCus(
		uchar_t c,
		uint_t nextState,
		Emitter& emitter,
		const utf8_t* p
	) {
		if (isReady(nextState)) {
			// State_Ready_Error_x is only possible for Cc_Ascii (0), Cc_Hdr_2 (2), Cc_Hdr_3 (3)
			// cc >> 1 yields exactly what we need: 0 -> 0, 2 -> 1, 3 -> 2
			uint_t cc = m_map[c];
			p += cc >> 1;
		}

		switch (nextState) {
		case State_Error_1:
		case State_Ready_Error:
			emitter.emitCu(p, 0x80 | (m_acc & 0x3f));
			break;

		case State_Error_2:
		case State_Ready_Error_2:
			emitter.emitCu(p + 1, 0x80 | (m_acc & 0x3f));
			emitter.emitCu(p, 0x80 | ((m_acc >> 6) & 0x3f));
			break;

		case State_Error_3:
		case State_Ready_Error_3:
			emitter.emitCu(p + 2, 0x80 | (m_acc & 0x3f));
			emitter.emitCu(p + 1, 0x80 | ((m_acc >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | ((m_acc >> 12) & 0x3f));
			break;

		case State_Cb_3_Error:
			emitter.emitCu(p + 2, 0x80 | (m_acc & 0x3f));
			break;
		}
	}